

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FArrayBox.cpp
# Opt level: O2

int __thiscall amrex::FArrayBox::readFrom(FArrayBox *this,istream *is,int compIndex)

{
  undefined8 in_RAX;
  FABio *pFVar1;
  int nCompAvailable;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  pFVar1 = FABio::read_header(is,this,compIndex,&local_34);
  (*pFVar1->_vptr_FABio[5])(pFVar1,is,this,(ulong)(uint)compIndex);
  (*pFVar1->_vptr_FABio[2])(pFVar1,is,this);
  (*pFVar1->_vptr_FABio[5])(pFVar1,is,this,(ulong)(uint)(~compIndex + local_34));
  (*pFVar1->_vptr_FABio[1])(pFVar1);
  return local_34;
}

Assistant:

int
FArrayBox::readFrom (std::istream& is, int compIndex)
{
//    BL_PROFILE("FArrayBox::readFrom_is_i");
    int nCompAvailable;
    FABio* fabrd = FABio::read_header(is, *this, compIndex, nCompAvailable);
    BL_ASSERT(compIndex >= 0 && compIndex < nCompAvailable);

    fabrd->skip(is, *this, compIndex);  // skip data up to the component we want
#ifdef AMREX_USE_GPU
    if (this->arena()->isManaged() || this->arena()->isDevice()) {
        FArrayBox hostfab(this->box(), 1, The_Pinned_Arena());
        fabrd->read(is, hostfab);
        Gpu::htod_memcpy_async(this->dataPtr(), hostfab.dataPtr(), hostfab.size()*sizeof(Real));
        Gpu::streamSynchronize();
    } else
#endif
    {
        fabrd->read(is, *this);
    }
    int remainingComponents = nCompAvailable - compIndex - 1;
    fabrd->skip(is, *this, remainingComponents);  // skip to the end

    delete fabrd;
    return nCompAvailable;
}